

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureMS5637.cpp
# Opt level: O2

bool __thiscall RTPressureMS5637::pressureRead(RTPressureMS5637 *this,RTIMU_DATA *data)

{
  bool bVar1;
  uint64_t uVar2;
  
  data->pressureValid = false;
  data->temperatureValid = false;
  data->temperature = 0.0;
  data->pressure = 0.0;
  if (this->m_state == 0) {
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                               this->m_pressureAddr,'H','\0',(uchar *)0x0,
                               "Failed to start MS5611 pressure conversion");
    if (!bVar1) {
      return false;
    }
    this->m_state = 2;
    uVar2 = RTMath::currentUSecsSinceEpoch();
    this->m_timer = uVar2;
  }
  pressureBackground(this);
  if (this->m_validReadings == true) {
    data->pressureValid = true;
    data->temperatureValid = true;
    data->temperature = this->m_temperature;
    data->pressure = this->m_pressure;
  }
  return true;
}

Assistant:

bool RTPressureMS5637::pressureRead(RTIMU_DATA& data)
{
    data.pressureValid = false;
    data.temperatureValid = false;
    data.temperature = 0;
    data.pressure = 0;

    if (m_state == MS5637_STATE_IDLE) {
        // start pressure conversion
        if (!m_settings->HALWrite(m_pressureAddr, MS5611_CMD_CONV_D1, 0, 0, "Failed to start MS5611 pressure conversion")) {
            return false;
        } else {
            m_state = MS5637_STATE_PRESSURE;
            m_timer = RTMath::currentUSecsSinceEpoch();
        }
    }

    pressureBackground();

    if (m_validReadings) {
        data.pressureValid = true;
        data.temperatureValid = true;
        data.temperature = m_temperature;
        data.pressure = m_pressure;
    }
    return true;
}